

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::LoadFlagsFromFile(string *path)

{
  bool bVar1;
  FILE *__stream;
  undefined8 extraout_RAX;
  FILE *file;
  long lVar2;
  ulong uVar3;
  undefined1 local_58 [8];
  string contents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  
  __stream = fopen((path->_M_dataplus)._M_p,"r");
  if (__stream != (FILE *)0x0) {
    ReadEntireFile_abi_cxx11_((string *)local_58,(internal *)__stream,file);
    fclose(__stream);
    contents.field_2._8_8_ = 0;
    SplitString((string *)local_58,'\n',
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&contents.field_2 + 8));
    if (contents.field_2._8_8_ != 0) {
      lVar2 = 8;
      uVar3 = 0;
      do {
        if (*(long *)(contents.field_2._8_8_ + lVar2) != 0) {
          bVar1 = ParseGoogleTestFlag(*(char **)(contents.field_2._8_8_ + -8 + lVar2));
          if (!bVar1) {
            g_help_flag = 1;
          }
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x20;
      } while (uVar3 < (ulong)((long)-contents.field_2._8_8_ >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&contents.field_2 + 8));
    if (local_58 != (undefined1  [8])&contents._M_string_length) {
      operator_delete((void *)local_58);
    }
    return;
  }
  LoadFlagsFromFile();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&contents.field_2 + 8));
  if (local_58 != (undefined1  [8])&contents._M_string_length) {
    operator_delete((void *)local_58);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void LoadFlagsFromFile(const std::string& path) {
  FILE* flagfile = posix::FOpen(path.c_str(), "r");
  if (!flagfile) {
    fprintf(stderr,
            "Unable to open file \"%s\"\n",
            GTEST_FLAG(flagfile).c_str());
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
  std::string contents(ReadEntireFile(flagfile));
  posix::FClose(flagfile);
  std::vector<std::string> lines;
  SplitString(contents, '\n', &lines);
  for (size_t i = 0; i < lines.size(); ++i) {
    if (lines[i].empty())
      continue;
    if (!ParseGoogleTestFlag(lines[i].c_str()))
      g_help_flag = true;
  }
}